

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

fct_logger_i * fct_standard_logger_new(void)

{
  fct_standard_logger_t *logger;
  
  logger = (fct_standard_logger_t *)calloc(1,0xc0);
  if (logger == (fct_standard_logger_t *)0x0) {
    logger = (fct_standard_logger_t *)0x0;
  }
  else {
    fct_logger__init((fct_logger_i *)logger);
    (logger->vtable).on_chk = fct_standard_logger__on_chk;
    (logger->vtable).on_test_start = fct_standard_logger__on_test_start;
    (logger->vtable).on_test_end = fct_standard_logger__on_test_end;
    (logger->vtable).on_fctx_start = fct_standard_logger__on_fctx_start;
    (logger->vtable).on_fctx_end = fct_standard_logger__on_fctx_end;
    (logger->vtable).on_delete = fct_standard_logger__on_delete;
    (logger->vtable).on_warn = fct_standard_logger__on_warn;
    (logger->vtable).on_test_skip = fct_standard_logger__on_test_skip;
    fct_nlist__init2(&logger->failed_cndtns_list,0);
    fct_timer__init(&logger->timer);
  }
  return (fct_logger_i *)logger;
}

Assistant:

fct_logger_i*
fct_standard_logger_new(void)
{
    fct_standard_logger_t *logger = (fct_standard_logger_t *)calloc(
                                        1, sizeof(fct_standard_logger_t)
                                    );
    if ( logger == NULL )
    {
        return NULL;
    }
    fct_logger__init((fct_logger_i*)logger);
    logger->vtable.on_chk = fct_standard_logger__on_chk;
    logger->vtable.on_test_start = fct_standard_logger__on_test_start;
    logger->vtable.on_test_end = fct_standard_logger__on_test_end;
    logger->vtable.on_fctx_start = fct_standard_logger__on_fctx_start;
    logger->vtable.on_fctx_end = fct_standard_logger__on_fctx_end;
    logger->vtable.on_delete = fct_standard_logger__on_delete;
    logger->vtable.on_warn = fct_standard_logger__on_warn;
    logger->vtable.on_test_skip = fct_standard_logger__on_test_skip;
    fct_nlist__init2(&(logger->failed_cndtns_list), 0);
    fct_timer__init(&(logger->timer));
    return (fct_logger_i*)logger;
}